

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          align_spec *spec,str_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  size_t __n;
  size_t size;
  void *pvVar5;
  void *__dest;
  char __tmp;
  ulong uVar6;
  basic_buffer<char> *c;
  ptrdiff_t _Num_2;
  size_t __len;
  size_t __n_00;
  
  uVar6 = (ulong)spec->width_;
  __n = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n_00 = uVar6 - __n;
  if (uVar6 < __n || __n_00 == 0) {
    uVar6 = lVar3 + __n;
    if ((ulong)puVar2[3] < uVar6) {
      (**(code **)*puVar2)(puVar2,uVar6);
      __n = f->size_;
    }
    puVar2[2] = uVar6;
    if (__n == 0) {
      return;
    }
    pvVar5 = (void *)(lVar3 + puVar2[1]);
LAB_001193f9:
    memmove(pvVar5,f->s,__n);
    return;
  }
  uVar6 = uVar6 + lVar3;
  if ((ulong)puVar2[3] < uVar6) {
    (**(code **)*puVar2)(puVar2,uVar6);
  }
  puVar2[2] = uVar6;
  pvVar5 = (void *)(lVar3 + puVar2[1]);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar6 = __n_00 >> 1;
    __dest = pvVar5;
    if (1 < __n_00) {
      __dest = (void *)((long)pvVar5 + uVar6);
      memset(pvVar5,(uint)bVar1,uVar6);
    }
    sVar4 = f->size_;
    if (sVar4 != 0) {
      memmove(__dest,f->s,sVar4);
    }
    __n_00 = __n_00 - uVar6;
    pvVar5 = (void *)((long)__dest + sVar4);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      memset(pvVar5,(uint)bVar1,__n_00);
      __n = f->size_;
      if (__n == 0) {
        return;
      }
      pvVar5 = (void *)((long)pvVar5 + __n_00);
      goto LAB_001193f9;
    }
    sVar4 = f->size_;
    if (sVar4 != 0) {
      memmove(pvVar5,f->s,sVar4);
    }
    pvVar5 = (void *)((long)pvVar5 + sVar4);
  }
  memset(pvVar5,(uint)bVar1,__n_00);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }